

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_package.c
# Opt level: O1

int lj_cf_package_module(lua_State *L)

{
  int iVar1;
  int iVar2;
  char *k;
  char *pcVar3;
  char *pcVar4;
  bool bVar5;
  lua_Debug lStack_98;
  
  k = luaL_checklstring(L,1,(size_t *)0x0);
  iVar1 = (int)((ulong)((long)L->top - (long)L->base) >> 3);
  lua_getfield(L,-10000,"_LOADED");
  lua_getfield(L,iVar1 + 1,k);
  iVar2 = lua_type(L,-1);
  if (iVar2 != 5) {
    L->top = L->top + -1;
    pcVar3 = luaL_findtable(L,-0x2712,k,1);
    if (pcVar3 != (char *)0x0) {
      lj_err_callerv(L,LJ_ERR_BADMODN,k);
    }
    lua_pushvalue(L,-1);
    lua_setfield(L,iVar1 + 1,k);
  }
  lua_getfield(L,-1,"_NAME");
  iVar2 = lua_type(L,-1);
  L->top = L->top + -1;
  if (iVar2 == 0) {
    lua_pushvalue(L,-1);
    lua_setfield(L,-2,"_M");
    lua_pushstring(L,k);
    lua_setfield(L,-2,"_NAME");
    pcVar4 = strrchr(k,0x2e);
    pcVar3 = pcVar4 + 1;
    if (pcVar4 == (char *)0x0) {
      pcVar3 = k;
    }
    lua_pushlstring(L,k,(long)pcVar3 - (long)k);
    lua_setfield(L,-2,"_PACKAGE");
  }
  lua_pushvalue(L,-1);
  iVar2 = lua_getstack(L,1,&lStack_98);
  if (iVar2 != 0) {
    iVar2 = lj_debug_getinfo(L,"f",(lj_Debug *)&lStack_98,0);
    if ((iVar2 != 0) &&
       ((*(int *)((long)L->top + -4) != -9 || (*(char *)((ulong)L->top[-1].u32.lo + 6) == '\0')))) {
      lua_pushvalue(L,-2);
      lua_setfenv(L,-2);
      L->top = L->top + -1;
      if (1 < iVar1) {
        iVar2 = 2;
        do {
          lua_pushvalue(L,iVar2);
          lua_pushvalue(L,-2);
          lj_vm_call(L,L->top + -1,1);
          bVar5 = iVar2 != iVar1;
          iVar2 = iVar2 + 1;
        } while (bVar5);
      }
      return 0;
    }
  }
  luaL_error(L,"\'module\' not called from a Lua function");
}

Assistant:

static int lj_cf_package_module(lua_State *L)
{
  const char *modname = luaL_checkstring(L, 1);
  int loaded = lua_gettop(L) + 1;  /* index of _LOADED table */
  lua_getfield(L, LUA_REGISTRYINDEX, "_LOADED");
  lua_getfield(L, loaded, modname);  /* get _LOADED[modname] */
  if (!lua_istable(L, -1)) {  /* not found? */
    lua_pop(L, 1);  /* remove previous result */
    /* try global variable (and create one if it does not exist) */
    if (luaL_findtable(L, LUA_GLOBALSINDEX, modname, 1) != NULL)
      lj_err_callerv(L, LJ_ERR_BADMODN, modname);
    lua_pushvalue(L, -1);
    lua_setfield(L, loaded, modname);  /* _LOADED[modname] = new table */
  }
  /* check whether table already has a _NAME field */
  lua_getfield(L, -1, "_NAME");
  if (!lua_isnil(L, -1)) {  /* is table an initialized module? */
    lua_pop(L, 1);
  } else {  /* no; initialize it */
    lua_pop(L, 1);
    modinit(L, modname);
  }
  lua_pushvalue(L, -1);
  setfenv(L);
  dooptions(L, loaded - 1);
  return 0;
}